

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<signed_char,(unsigned_char)16>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  u8 i;
  long lVar1;
  short sVar2;
  Simd<short,_(unsigned_char)__b_> SVar3;
  Simd<signed_char,_(unsigned_char)__x10_> result;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  Simd<signed_char,_(unsigned_char)__x10_> local_38;
  short local_28 [8];
  short local_18 [8];
  
  local_18 = (short  [8])Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  SVar3 = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  local_28[0] = SVar3.v[0];
  local_28[1] = SVar3.v[1];
  local_28[2] = SVar3.v[2];
  local_28[3] = SVar3.v[3];
  local_28[4] = SVar3.v[4];
  local_28[5] = SVar3.v[5];
  local_28[6] = SVar3.v[6];
  local_28[7] = SVar3.v[7];
  lVar1 = 0;
  do {
    sVar2 = local_28[lVar1];
    if (local_28[lVar1] < -0x7f) {
      sVar2 = -0x80;
    }
    if (0x7e < sVar2) {
      sVar2 = 0x7f;
    }
    local_38.v[lVar1] = (char)sVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  lVar1 = 0;
  do {
    sVar2 = local_18[lVar1];
    if (local_18[lVar1] < -0x7f) {
      sVar2 = -0x80;
    }
    if (0x7e < sVar2) {
      sVar2 = 0x7f;
    }
    local_38.v[lVar1 + 8] = (char)sVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  Push<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this,local_38);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}